

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O1

void __thiscall ctemplate::Template::StripBuffer(Template *this,char **buffer,size_t *len)

{
  ulong uVar1;
  char **ppcVar2;
  char *pcVar3;
  void *pvVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  char *line;
  char *buffer_00;
  MarkerDelimiters delim;
  MarkerDelimiters local_60;
  char **local_40;
  Template *local_38;
  
  if (this->strip_ != DO_NOT_STRIP) {
    line = *buffer;
    uVar1 = *len;
    local_40 = buffer;
    local_38 = this;
    pcVar3 = (char *)operator_new__(uVar1);
    local_60.start_marker = "{{";
    local_60.start_marker_len = 2;
    local_60.end_marker = "}}";
    local_60.end_marker_len = 2;
    buffer_00 = pcVar3;
    if (0 < (long)uVar1) {
      pcVar9 = line + uVar1;
      do {
        pvVar4 = memchr(line,10,(long)pcVar9 - (long)line);
        pcVar8 = (char *)((long)pvVar4 + 1);
        if (pvVar4 == (void *)0x0) {
          pcVar8 = pcVar9;
        }
        sVar10 = (long)pcVar8 - (long)line;
        sVar5 = InsertLine(line,sVar10,local_38->strip_,&local_60,buffer_00);
        buffer_00 = buffer_00 + sVar5;
        if ((buffer_00 < pcVar3) || (*len < (ulong)((long)buffer_00 - (long)pcVar3))) {
          __assert_fail("write_pos >= retval && static_cast<size_t>(write_pos-retval) <= *len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                        ,0x9f4,"void ctemplate::Template::StripBuffer(char **, size_t *)");
        }
        if (line != (char *)0x0) {
          while (sVar5 = local_60.start_marker_len,
                pcVar6 = anon_unknown_14::memmatch
                                   (line,sVar10,local_60.start_marker,local_60.start_marker_len),
                sVar10 = local_60.end_marker_len, pcVar6 != (char *)0x0) {
            pcVar6 = pcVar6 + sVar5;
            pcVar7 = anon_unknown_14::memmatch
                               (pcVar6,(long)pcVar8 - (long)pcVar6,local_60.end_marker,
                                local_60.end_marker_len);
            if (pcVar7 == (char *)0x0) break;
            if ((long)pcVar7 - (long)pcVar6 < 0) {
              __assert_fail("((end_marker - delim.end_marker_len) - (marker + delim.start_marker_len)) >= 0"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                            ,0xa0a,"void ctemplate::Template::StripBuffer(char **, size_t *)");
            }
            line = pcVar7 + sVar10;
            ParseDelimiters(pcVar6,(long)pcVar7 - (long)pcVar6,&local_60);
            sVar10 = (long)pcVar8 - (long)line;
          }
        }
        line = pcVar8;
      } while (pcVar8 < pcVar9);
    }
    ppcVar2 = local_40;
    if (buffer_00 < pcVar3) {
      __assert_fail("write_pos >= retval",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                    ,0xa11,"void ctemplate::Template::StripBuffer(char **, size_t *)");
    }
    if (*local_40 != (char *)0x0) {
      operator_delete__(*local_40);
    }
    *ppcVar2 = pcVar3;
    *len = (long)buffer_00 - (long)pcVar3;
  }
  return;
}

Assistant:

void Template::StripBuffer(char **buffer, size_t* len) {
  if (strip_ == DO_NOT_STRIP)
    return;

  char* bufend = *buffer + *len;
  char* retval = new char[*len];
  char* write_pos = retval;

  MarkerDelimiters delim;

  const char* next_pos = NULL;
  for (const char* prev_pos = *buffer; prev_pos < bufend; prev_pos = next_pos) {
    next_pos = (char*)memchr(prev_pos, '\n', bufend - prev_pos);
    if (next_pos)
      next_pos++;          // include the newline
    else
      next_pos = bufend;   // for the last line, when it has no newline

    write_pos += InsertLine(prev_pos, next_pos - prev_pos, strip_, delim,
                            write_pos);
    assert(write_pos >= retval &&
           static_cast<size_t>(write_pos-retval) <= *len);

    // Before looking at the next line, see if the current line
    // changed the marker-delimiter.  We care for
    // IsBlankOrOnlyHasOneRemovableMarker, so we don't need to be
    // perfect -- we don't have to handle the delimiter changing in
    // the middle of a line -- just make sure that the next time
    // there's only one marker on a line, we notice because we know
    // the right delim.
    const char* end_marker = NULL;
    for (const char* marker = prev_pos; marker; marker = end_marker) {
      marker = memmatch(marker, next_pos - marker,
                        delim.start_marker, delim.start_marker_len);
      if (!marker)  break;
      end_marker = memmatch(marker + delim.start_marker_len,
                            next_pos - (marker + delim.start_marker_len),
                            delim.end_marker, delim.end_marker_len);
      if (!end_marker)  break;
      end_marker += delim.end_marker_len;  // needed for the for loop
      // This tries to parse the marker as a set-delimiters marker.
      // If it succeeds, it updates delim. If not, it ignores it.
      assert(((end_marker - delim.end_marker_len)
              - (marker + delim.start_marker_len)) >= 0);
      Template::ParseDelimiters(marker + delim.start_marker_len,
                                ((end_marker - delim.end_marker_len)
                                 - (marker + delim.start_marker_len)),
                                &delim);
    }
  }
  assert(write_pos >= retval);

  // Replace the input retval with our new retval.
  delete[] *buffer;
  *buffer = retval;
  *len = static_cast<size_t>(write_pos - retval);
}